

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_finish_event.cpp
# Opt level: O3

TaskExecutionResult __thiscall
duckdb::PipelineFinishTask::ExecuteTask(PipelineFinishTask *this,TaskExecutionMode mode)

{
  _Atomic_word *p_Var1;
  shared_ptr<duckdb::Event,_true> *this_00;
  atomic<unsigned_long> *paVar2;
  __int_type _Var3;
  Pipeline *pPVar4;
  __int_type _Var5;
  optional_ptr<duckdb::PhysicalOperator,_true> oVar6;
  int iVar7;
  type pEVar8;
  pointer pGVar9;
  Event *this_01;
  TaskExecutionResult TVar10;
  optional_ptr<duckdb::PhysicalOperator,_true> sink;
  OperatorSinkFinalizeInput finalize_input;
  InterruptState interrupt_state;
  optional_ptr<duckdb::PhysicalOperator,_true> local_78;
  enable_shared_from_this<duckdb::Task> local_70;
  weak_ptr<duckdb::Task,_true> local_60;
  InterruptState local_50;
  
  local_78.ptr = (this->pipeline->sink).ptr;
  enable_shared_from_this<duckdb::Task>::shared_from_this(&local_70);
  local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_70.__weak_this_.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_70.__weak_this_.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_70.__weak_this_.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70.__weak_this_.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_70.__weak_this_.internal.
            super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_70.__weak_this_.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_70.__weak_this_.internal.
            super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_weak_count + 1;
    }
  }
  InterruptState::InterruptState(&local_50,&local_60);
  if (local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar7 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar7 = (local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*(local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_70.__weak_this_.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.__weak_this_.internal.
               super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&local_78);
  local_70.__weak_this_.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
       operator*(&(local_78.ptr)->sink_state);
  local_70.__weak_this_.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_50;
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&local_78);
  oVar6.ptr = local_78.ptr;
  pPVar4 = this->pipeline;
  this_00 = &(this->super_ExecutorTask).event;
  pEVar8 = shared_ptr<duckdb::Event,_true>::operator*(this_00);
  iVar7 = (*(oVar6.ptr)->_vptr_PhysicalOperator[0x1d])
                    (oVar6.ptr,pPVar4,pEVar8,((this->super_ExecutorTask).executor)->context,
                     &local_70);
  TVar10 = TASK_BLOCKED;
  if ((SinkFinalizeType)iVar7 != BLOCKED) {
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&local_78);
    pGVar9 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&(local_78.ptr)->sink_state);
    pGVar9->state = (SinkFinalizeType)iVar7;
    this_01 = shared_ptr<duckdb::Event,_true>::operator->(this_00);
    _Var5 = (this_01->total_tasks).super___atomic_base<unsigned_long>._M_i;
    LOCK();
    paVar2 = &this_01->finished_tasks;
    _Var3 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
    (paVar2->super___atomic_base<unsigned_long>)._M_i =
         (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (_Var3 + 1 == _Var5) {
      Event::Finish(this_01);
    }
    TVar10 = TASK_FINISHED;
  }
  if (local_50.signal_state.internal.
      super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_50.signal_state.internal.
                 super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar7 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar7 = (local_50.signal_state.internal.
               super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_50.signal_state.internal.
       super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*(local_50.signal_state.internal.
         super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_50.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_50.current_task.internal.
                 super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar7 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar7 = (local_50.current_task.internal.
               super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count;
      (local_50.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*(local_50.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return TVar10;
}

Assistant:

TaskExecutionResult ExecuteTask(TaskExecutionMode mode) override {
		auto sink = pipeline.GetSink();
		InterruptState interrupt_state(shared_from_this());
		OperatorSinkFinalizeInput finalize_input {*sink->sink_state, interrupt_state};

#ifdef DUCKDB_DEBUG_ASYNC_SINK_SOURCE
		if (debug_blocked_count < debug_blocked_target_count) {
			debug_blocked_count++;

			auto &callback_state = interrupt_state;
			std::thread rewake_thread([callback_state] {
				std::this_thread::sleep_for(std::chrono::milliseconds(1));
				callback_state.Callback();
			});
			rewake_thread.detach();

			return TaskExecutionResult::TASK_BLOCKED;
		}
#endif
		auto sink_state = sink->Finalize(pipeline, *event, executor.context, finalize_input);

		if (sink_state == SinkFinalizeType::BLOCKED) {
			return TaskExecutionResult::TASK_BLOCKED;
		}

		sink->sink_state->state = sink_state;
		event->FinishTask();
		return TaskExecutionResult::TASK_FINISHED;
	}